

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void * __thiscall
kj::anon_unknown_8::DiskHandle::mmap
          (DiskHandle *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  void *pvVar1;
  UnwindDetector in_register_0000000c;
  DiskHandle size;
  MmapRange MVar2;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  size.fd.unwindDetector.uncaughtCount = in_register_0000000c.uncaughtCount;
  size.fd.fd = __prot;
  MVar2 = getMmapRange(__len,(uint64_t)size.fd);
  pvVar1 = ::mmap((void *)0x0,MVar2.size,1,1,*__addr,MVar2.offset);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    this->fd = (AutoCloseFd)((long)pvVar1 + (__len - MVar2.offset));
    this[1].fd = size.fd;
    this[2].fd = (AutoCloseFd)&(anonymous_namespace)::mmapDisposer;
    return this;
  }
  __errno_location();
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const {
    auto range = getMmapRange(offset, size);
    const void* mapping = ::mmap(NULL, range.size, PROT_READ, MAP_SHARED, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<const byte>(reinterpret_cast<const byte*>(mapping) + (offset - range.offset),
                             size, mmapDisposer);
  }